

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O3

void __thiscall duckdb::ParquetWriter::Flush(ParquetWriter *this,ColumnDataCollection *buffer)

{
  PreparedRowGroup prepared_row_group;
  PreparedRowGroup PStack_98;
  
  if (buffer->count != 0) {
    duckdb_parquet::RowGroup::RowGroup(&PStack_98.row_group);
    PStack_98.states.
    super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    PStack_98.states.
    super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    PStack_98.states.
    super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    PrepareRowGroup(this,buffer,&PStack_98);
    ColumnDataCollection::Reset(buffer);
    FlushRowGroup(this,&PStack_98);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
    ::~vector(&PStack_98.states.
               super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
             );
    duckdb_parquet::RowGroup::~RowGroup(&PStack_98.row_group);
  }
  return;
}

Assistant:

void ParquetWriter::Flush(ColumnDataCollection &buffer) {
	if (buffer.Count() == 0) {
		return;
	}

	PreparedRowGroup prepared_row_group;
	PrepareRowGroup(buffer, prepared_row_group);
	buffer.Reset();

	FlushRowGroup(prepared_row_group);
}